

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignExtLowering.cpp
# Opt level: O0

void __thiscall
wasm::SignExtLowering::lowerToShifts<int>
          (SignExtLowering *this,Expression *value,BinaryOp leftShift,BinaryOp rightShift,
          int originalBits)

{
  Module *wasm;
  Const *pCVar1;
  Binary *pBVar2;
  Builder local_30;
  Builder builder;
  int shiftBits;
  int originalBits_local;
  BinaryOp rightShift_local;
  BinaryOp leftShift_local;
  Expression *value_local;
  SignExtLowering *this_local;
  
  builder.wasm._0_4_ = 0x20 - originalBits;
  builder.wasm._4_4_ = originalBits;
  wasm = Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>::getModule
                   (&(this->
                     super_WalkerPass<wasm::PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>_>
                     ).
                     super_PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>
                     .
                     super_Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>
                   );
  Builder::Builder(&local_30,wasm);
  pCVar1 = Builder::makeConst<int>(&local_30,(int)builder.wasm);
  pBVar2 = Builder::makeBinary(&local_30,leftShift,value,(Expression *)pCVar1);
  pCVar1 = Builder::makeConst<int>(&local_30,(int)builder.wasm);
  pBVar2 = Builder::makeBinary(&local_30,rightShift,(Expression *)pBVar2,(Expression *)pCVar1);
  Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>_>
              ).super_PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>
              .super_Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>,
             (Expression *)pBVar2);
  return;
}

Assistant:

void lowerToShifts(Expression* value,
                     BinaryOp leftShift,
                     BinaryOp rightShift,
                     T originalBits) {
    // To sign-extend, we shift all the way left so the effective sign bit is
    // where the actual sign bit is. For example, when sign-extending i8, the
    // effective sign bit is at bit 8, and we shift it to the actual place of
    // the sign bit, which is 32 for i32 or 64 for i64. Then we do a signed
    // shift in the other direction, which fills with the proper bit all the
    // way back, so e.g.
    //
    //  0x000000ff  =(shift left)=>  0xff000000  =(shift right)=>  0xffffffff
    //
    T shiftBits = (sizeof(T) * 8) - originalBits;
    Builder builder(*getModule());
    replaceCurrent(builder.makeBinary(
      rightShift,
      builder.makeBinary(leftShift, value, builder.makeConst(shiftBits)),
      builder.makeConst(shiftBits)));
  }